

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O1

int json_dump_file(json_t *json,char *path,size_t flags)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  
  __stream = fopen(path,"w");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = json_dump_callback(json,dump_to_file,__stream,flags);
    iVar2 = fclose(__stream);
    uVar1 = -(uint)(iVar2 != 0) | uVar1;
  }
  return uVar1;
}

Assistant:

int json_dump_file(const json_t *json, const char *path, size_t flags) {
    int result;

    FILE *output = fopen(path, "w");
    if (!output)
        return -1;

    result = json_dumpf(json, output, flags);

    if (fclose(output) != 0)
        return -1;

    return result;
}